

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,ExpansionRule rule)

{
  int iVar1;
  ExpansionRule rule_local;
  string *s;
  
  iVar1 = (int)this;
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  if (iVar1 == 0) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"expandPrims");
  }
  else if (iVar1 == 1) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"explicitOnly");
  }
  else if (iVar1 == 2) {
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,"expandPrimsAndProperties");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::CollectionInstance::ExpansionRule rule) {
  std::string s;

  switch (rule) {
    case tinyusdz::CollectionInstance::ExpansionRule::ExplicitOnly: {
      s = kExplicitOnly;
      break;
    }
    case tinyusdz::CollectionInstance::ExpansionRule::ExpandPrims: {
      s = kExpandPrims;
      break;
    }
    case tinyusdz::CollectionInstance::ExpansionRule::ExpandPrimsAndProperties: {
      s = kExpandPrimsAndProperties;
      break;
    }
  }

  return s;
}